

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer.cc
# Opt level: O0

bool __thiscall google::protobuf::io::Tokenizer::Next(Tokenizer *this)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  ErrorCollector *pEVar4;
  bool bVar5;
  NextCommentStatus NVar6;
  TokenType TVar7;
  bool local_d2;
  bool local_d1;
  bool local_b9;
  uchar local_a9;
  FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355> local_a8;
  string local_98;
  undefined1 local_78 [16];
  basic_string_view<char,_std::char_traits<char>_> local_68 [2];
  allocator<char> local_41;
  string local_40;
  bool local_19;
  Tokenizer *pTStack_18;
  bool report_token;
  Tokenizer *this_local;
  
  pTStack_18 = this;
  Token::operator=(&this->previous_,&this->current_);
  do {
    if (((this->read_error_ ^ 0xffU) & 1) == 0) {
LAB_00498a1e:
      (this->current_).type = TYPE_END;
      std::__cxx11::string::clear();
      (this->current_).line = this->line_;
      (this->current_).column = this->column_;
      (this->current_).end_column = this->column_;
      return false;
    }
    StartToken(this);
    bVar5 = TryConsumeWhitespace(this);
    local_b9 = true;
    if (!bVar5) {
      local_b9 = TryConsumeNewline(this);
    }
    local_19 = local_b9;
    EndToken(this);
    if ((local_19 & 1U) != 0) {
      return true;
    }
    NVar6 = TryConsumeCommentStart(this);
    switch(NVar6) {
    case LINE_COMMENT:
      ConsumeLineComment(this,(string *)0x0);
      break;
    case BLOCK_COMMENT:
      ConsumeBlockComment(this,(string *)0x0);
      break;
    case SLASH_NOT_COMMENT:
      return true;
    case NO_COMMENT:
    default:
      if ((this->read_error_ & 1U) != 0) goto LAB_00498a1e;
      bVar5 = LookingAt<google::protobuf::io::(anonymous_namespace)::Unprintable>(this);
      if ((!bVar5) && (this->current_char_ != '\0')) {
        StartToken(this);
        bVar5 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::Letter>(this);
        if (bVar5) {
          ConsumeZeroOrMore<google::protobuf::io::(anonymous_namespace)::Alphanumeric>(this);
          (this->current_).type = TYPE_IDENTIFIER;
        }
        else {
          bVar5 = TryConsume(this,'0');
          if (bVar5) {
            TVar7 = ConsumeNumber(this,true,false);
            (this->current_).type = TVar7;
          }
          else {
            bVar5 = TryConsume(this,'.');
            if (bVar5) {
              bVar5 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::Digit>(this);
              if (bVar5) {
                if ((((this->previous_).type == TYPE_IDENTIFIER) &&
                    ((this->current_).line == (this->previous_).line)) &&
                   ((this->current_).column == (this->previous_).end_column)) {
                  pEVar4 = this->error_collector_;
                  uVar2 = this->line_;
                  iVar1 = this->column_;
                  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                            (local_68,"Need space between identifier and decimal point.");
                  (*pEVar4->_vptr_ErrorCollector[2])
                            (pEVar4,(ulong)uVar2,(ulong)(iVar1 - 2),local_68[0]._M_len,
                             local_68[0]._M_str);
                }
                TVar7 = ConsumeNumber(this,false,true);
                (this->current_).type = TVar7;
              }
              else {
                (this->current_).type = TYPE_SYMBOL;
              }
            }
            else {
              bVar5 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::Digit>(this);
              if (bVar5) {
                TVar7 = ConsumeNumber(this,false,false);
                (this->current_).type = TVar7;
              }
              else {
                bVar5 = TryConsume(this,'\"');
                if (bVar5) {
                  ConsumeString(this,'\"');
                  (this->current_).type = TYPE_STRING;
                }
                else {
                  bVar5 = TryConsume(this,'\'');
                  if (bVar5) {
                    ConsumeString(this,'\'');
                    (this->current_).type = TYPE_STRING;
                  }
                  else {
                    if (((int)this->current_char_ & 0x80U) != 0) {
                      pEVar4 = this->error_collector_;
                      uVar2 = this->line_;
                      uVar3 = this->column_;
                      absl::lts_20240722::str_format_internal::
                      FormatSpecTemplate<(absl::lts_20240722::FormatConversionCharSet)655355>::
                      FormatSpecTemplate(&local_a8,"Interpreting non ascii codepoint %d.");
                      local_a9 = this->current_char_;
                      absl::lts_20240722::StrFormat<unsigned_char>(&local_98,&local_a8,&local_a9);
                      local_78 = std::__cxx11::string::operator_cast_to_basic_string_view
                                           ((string *)&local_98);
                      (*pEVar4->_vptr_ErrorCollector[2])
                                (pEVar4,(ulong)uVar2,(ulong)uVar3,local_78._0_8_,local_78._8_8_);
                      std::__cxx11::string::~string((string *)&local_98);
                    }
                    NextChar(this);
                    (this->current_).type = TYPE_SYMBOL;
                  }
                }
              }
            }
          }
        }
        EndToken(this);
        return true;
      }
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Invalid control characters encountered in text.",&local_41);
      AddError(this,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      std::allocator<char>::~allocator(&local_41);
      NextChar(this);
      do {
        bVar5 = TryConsumeOne<google::protobuf::io::(anonymous_namespace)::Unprintable>(this);
        local_d1 = true;
        if (!bVar5) {
          local_d2 = false;
          if ((this->read_error_ & 1U) == 0) {
            local_d2 = TryConsume(this,'\0');
          }
          local_d1 = local_d2;
        }
      } while (local_d1 != false);
    }
  } while( true );
}

Assistant:

bool Tokenizer::Next() {
  previous_ = current_;

  while (!read_error_) {
    StartToken();
    bool report_token = TryConsumeWhitespace() || TryConsumeNewline();
    EndToken();
    if (report_token) {
      return true;
    }

    switch (TryConsumeCommentStart()) {
      case LINE_COMMENT:
        ConsumeLineComment(NULL);
        continue;
      case BLOCK_COMMENT:
        ConsumeBlockComment(NULL);
        continue;
      case SLASH_NOT_COMMENT:
        return true;
      case NO_COMMENT:
        break;
    }

    // Check for EOF before continuing.
    if (read_error_) break;

    if (LookingAt<Unprintable>() || current_char_ == '\0') {
      AddError("Invalid control characters encountered in text.");
      NextChar();
      // Skip more unprintable characters, too.  But, remember that '\0' is
      // also what current_char_ is set to after EOF / read error.  We have
      // to be careful not to go into an infinite loop of trying to consume
      // it, so make sure to check read_error_ explicitly before consuming
      // '\0'.
      while (TryConsumeOne<Unprintable>() ||
             (!read_error_ && TryConsume('\0'))) {
        // Ignore.
      }

    } else {
      // Reading some sort of token.
      StartToken();

      if (TryConsumeOne<Letter>()) {
        ConsumeZeroOrMore<Alphanumeric>();
        current_.type = TYPE_IDENTIFIER;
      } else if (TryConsume('0')) {
        current_.type = ConsumeNumber(true, false);
      } else if (TryConsume('.')) {
        // This could be the beginning of a floating-point number, or it could
        // just be a '.' symbol.

        if (TryConsumeOne<Digit>()) {
          // It's a floating-point number.
          if (previous_.type == TYPE_IDENTIFIER &&
              current_.line == previous_.line &&
              current_.column == previous_.end_column) {
            // We don't accept syntax like "blah.123".
            error_collector_->RecordError(
                line_, column_ - 2,
                "Need space between identifier and decimal point.");
          }
          current_.type = ConsumeNumber(false, true);
        } else {
          current_.type = TYPE_SYMBOL;
        }
      } else if (TryConsumeOne<Digit>()) {
        current_.type = ConsumeNumber(false, false);
      } else if (TryConsume('\"')) {
        ConsumeString('\"');
        current_.type = TYPE_STRING;
      } else if (TryConsume('\'')) {
        ConsumeString('\'');
        current_.type = TYPE_STRING;
      } else {
        // Check if the high order bit is set.
        if (current_char_ & 0x80) {
          error_collector_->RecordError(
              line_, column_,
              absl::StrFormat("Interpreting non ascii codepoint %d.",
                              static_cast<unsigned char>(current_char_)));
        }
        NextChar();
        current_.type = TYPE_SYMBOL;
      }

      EndToken();
      return true;
    }
  }

  // EOF
  current_.type = TYPE_END;
  current_.text.clear();
  current_.line = line_;
  current_.column = column_;
  current_.end_column = column_;
  return false;
}